

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void integer_suite::test_uint16_4(void)

{
  undefined4 local_160;
  value local_15c [2];
  undefined4 local_154;
  unsigned_short local_150 [2];
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [5];
  
  decoder.current.scan._259_4_ = 0x34333231;
  decoder.current.scan._263_1_ = 0;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [5])((long)&decoder.current.scan + 0x103));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x304,"void integer_suite::test_uint16_4()",local_148,&local_14c);
  local_150[0] = trial::protocol::json::detail::basic_decoder<char>::unsigned_value<unsigned_short>
                           ((basic_decoder<char> *)local_140);
  local_154 = 0x4d2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_int>
            ("decoder.unsigned_value<std::uint16_t>()","1234U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x305,"void integer_suite::test_uint16_4()",local_150,&local_154);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_140);
  local_15c[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_160 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x307,"void integer_suite::test_uint16_4()",local_15c,&local_160);
  return;
}

Assistant:

void test_uint16_4()
{
    const char input[] = "1234";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.unsigned_value<std::uint16_t>(), 1234U);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}